

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v6::basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
          (basic_string_view<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  
  uVar1 = std::__cxx11::string::data();
  *in_RDI = uVar1;
  uVar1 = std::__cxx11::string::size();
  in_RDI[1] = uVar1;
  return;
}

Assistant:

FMT_CONSTEXPR basic_string_view(
      const std::basic_string<Char, Traits, Alloc>& s) FMT_NOEXCEPT
      : data_(s.data()),
        size_(s.size()) {}

  template <
      typename S,
      FMT_ENABLE_IF(std::is_same<S, internal::std_string_view<Char>>::value)>
  FMT_CONSTEXPR basic_string_view(S s) FMT_NOEXCEPT : data_(s.data()),
                                                      size_(s.size()) {}

  /** Returns a pointer to the string data. */
  FMT_CONSTEXPR const Char* data() const { return data_; }